

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLReader::doInitDecode(XMLReader *this)

{
  XMLByte XVar1;
  XMLSize_t XVar2;
  int iVar3;
  TranscodingException *pTVar4;
  MemoryManager *pMVar5;
  ulong local_f8;
  XMLSize_t index;
  ArrayJanitor<char16_t> janValue_7;
  XMLByte *pXStack_d8;
  XMLCh chCur;
  XMLByte *srcPtr;
  undefined1 local_c8 [6];
  UTF16Ch curVal_1;
  ArrayJanitor<char16_t> janValue_6;
  ArrayJanitor<char16_t> janValue_5;
  UTF16Ch *asUTF16;
  XMLSize_t postBOMIndex;
  ArrayJanitor<char16_t> janValue_4;
  ArrayJanitor<char16_t> janValue_3;
  XMLByte *pXStack_70;
  char curCh;
  char *asChars;
  ArrayJanitor<char16_t> janValue_2;
  undefined1 local_50 [4];
  UCS4Ch curVal;
  ArrayJanitor<char16_t> janValue_1;
  undefined1 local_30 [8];
  ArrayJanitor<char16_t> janValue;
  UCS4Ch *asUCS;
  XMLSize_t i;
  XMLReader *this_local;
  
  switch(this->fEncoding) {
  case EBCDIC:
    pXStack_d8 = this->fRawByteBuf;
    do {
      janValue_7.fMemoryManager._6_2_ = XMLEBCDICTranscoder::xlatThisOne(*pXStack_d8);
      this->fRawBufIndex = this->fRawBufIndex + 1;
      if (this->fCharsAvail == 0x3fff) {
        this->fCharsAvail = 0;
        this->fRawBufIndex = 0;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
        ArrayJanitor<char16_t>::ArrayJanitor
                  ((ArrayJanitor<char16_t> *)&index,this->fSystemId,this->fMemoryManager);
        pTVar4 = (TranscodingException *)__cxa_allocate_exception(0x30);
        TranscodingException::TranscodingException
                  (pTVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                   ,0x71f,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0,this->fMemoryManager);
        __cxa_throw(pTVar4,&TranscodingException::typeinfo,
                    TranscodingException::~TranscodingException);
      }
      this->fCharSizeBuf[this->fCharsAvail] = '\x01';
      XVar2 = this->fCharsAvail;
      this->fCharsAvail = XVar2 + 1;
      this->fCharBuf[XVar2] = janValue_7.fMemoryManager._6_2_;
    } while ((janValue_7.fMemoryManager._6_2_ != L'>') &&
            (pXStack_d8 = pXStack_d8 + 1, this->fRawBufIndex != this->fRawBytesAvail));
    break;
  case UCS_4B:
  case UCS_4L:
    if (((((this->fRawByteBuf[0] == '\0') && (this->fRawByteBuf[1] == '\0')) &&
         (this->fRawByteBuf[2] == 0xfe)) && (this->fRawByteBuf[3] == 0xff)) ||
       (((this->fRawByteBuf[0] == 0xff && (this->fRawByteBuf[1] == 0xfe)) &&
        ((this->fRawByteBuf[2] == '\0' && (this->fRawByteBuf[3] == '\0')))))) {
      for (asUCS = (UCS4Ch *)0x0; asUCS < (UCS4Ch *)this->fRawBytesAvail;
          asUCS = (UCS4Ch *)((long)asUCS + 1)) {
        this->fRawByteBuf[(long)asUCS] = (this->fRawByteBuf + 4)[(long)asUCS];
      }
      this->fRawBytesAvail = this->fRawBytesAvail - 4;
    }
    janValue.fMemoryManager = (MemoryManager *)this->fRawByteBuf;
    do {
      if (this->fRawBytesAvail <= this->fRawBufIndex) break;
      if (this->fRawBytesAvail < this->fRawBufIndex + 4) {
        this->fCharsAvail = 0;
        this->fRawBufIndex = 0;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
        ArrayJanitor<char16_t>::ArrayJanitor
                  ((ArrayJanitor<char16_t> *)local_30,this->fSystemId,this->fMemoryManager);
        pTVar4 = (TranscodingException *)__cxa_allocate_exception(0x30);
        TranscodingException::TranscodingException
                  (pTVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                   ,0x609,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0,this->fMemoryManager);
        __cxa_throw(pTVar4,&TranscodingException::typeinfo,
                    TranscodingException::~TranscodingException);
      }
      if (this->fCharsAvail == 0x3fff) {
        this->fCharsAvail = 0;
        this->fRawBufIndex = 0;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
        ArrayJanitor<char16_t>::ArrayJanitor
                  ((ArrayJanitor<char16_t> *)local_50,this->fSystemId,this->fMemoryManager);
        pTVar4 = (TranscodingException *)__cxa_allocate_exception(0x30);
        TranscodingException::TranscodingException
                  (pTVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                   ,0x61a,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0,this->fMemoryManager);
        __cxa_throw(pTVar4,&TranscodingException::typeinfo,
                    TranscodingException::~TranscodingException);
      }
      pMVar5 = (MemoryManager *)((long)&(janValue.fMemoryManager)->_vptr_MemoryManager + 4);
      janValue_2.fMemoryManager._4_4_ = *(UCS4Ch *)&(janValue.fMemoryManager)->_vptr_MemoryManager;
      this->fRawBufIndex = this->fRawBufIndex + 4;
      janValue.fMemoryManager = pMVar5;
      if ((this->fSwapped & 1U) != 0) {
        janValue_2.fMemoryManager._4_4_ = BitOps::swapBytes(janValue_2.fMemoryManager._4_4_);
      }
      if (0xffff < (uint)janValue_2.fMemoryManager._4_4_) {
        this->fCharsAvail = 0;
        this->fRawBufIndex = 0;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
        ArrayJanitor<char16_t>::ArrayJanitor
                  ((ArrayJanitor<char16_t> *)&asChars,this->fSystemId,this->fMemoryManager);
        pTVar4 = (TranscodingException *)__cxa_allocate_exception(0x30);
        TranscodingException::TranscodingException
                  (pTVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                   ,0x633,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0,this->fMemoryManager);
        __cxa_throw(pTVar4,&TranscodingException::typeinfo,
                    TranscodingException::~TranscodingException);
      }
      this->fCharSizeBuf[this->fCharsAvail] = '\x04';
      XVar2 = this->fCharsAvail;
      this->fCharsAvail = XVar2 + 1;
      this->fCharBuf[XVar2] = (XMLCh)janValue_2.fMemoryManager._4_4_;
    } while (janValue_2.fMemoryManager._4_4_ != L'>');
    break;
  default:
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fSystemId);
    pTVar4 = (TranscodingException *)__cxa_allocate_exception(0x30);
    TranscodingException::TranscodingException
              (pTVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
               ,0x73a,Reader_BadAutoEncoding,this->fMemoryManager);
    __cxa_throw(pTVar4,&TranscodingException::typeinfo,TranscodingException::~TranscodingException);
  case UTF_8:
    pXStack_70 = this->fRawByteBuf;
    if ((3 < this->fRawBytesAvail) &&
       (iVar3 = XMLString::compareNString((char *)pXStack_70,(char *)&XMLRecognizer::fgUTF8BOM,3),
       iVar3 == 0)) {
      this->fRawBufIndex = this->fRawBufIndex + 3;
      pXStack_70 = this->fRawByteBuf + 3;
    }
    if ((5 < this->fRawBytesAvail) &&
       (iVar3 = XMLString::compareNString((char *)pXStack_70,"<?xml ",6), iVar3 == 0)) {
      while (this->fRawBufIndex < this->fRawBytesAvail) {
        XVar1 = *pXStack_70;
        this->fRawBufIndex = this->fRawBufIndex + 1;
        if (this->fCharsAvail == 0x3fff) {
          this->fCharsAvail = 0;
          this->fRawBufIndex = 0;
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
          ArrayJanitor<char16_t>::ArrayJanitor
                    ((ArrayJanitor<char16_t> *)&janValue_4.fMemoryManager,this->fSystemId,
                     this->fMemoryManager);
          pTVar4 = (TranscodingException *)__cxa_allocate_exception(0x30);
          TranscodingException::TranscodingException
                    (pTVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                     ,0x677,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0
                     ,(XMLCh *)0x0,this->fMemoryManager);
          __cxa_throw(pTVar4,&TranscodingException::typeinfo,
                      TranscodingException::~TranscodingException);
        }
        this->fCharSizeBuf[this->fCharsAvail] = '\x01';
        XVar2 = this->fCharsAvail;
        this->fCharsAvail = XVar2 + 1;
        this->fCharBuf[XVar2] = (short)(char)XVar1;
        if (XVar1 == '>') break;
        pXStack_70 = pXStack_70 + 1;
        if (((int)(char)XVar1 & 0x80U) != 0) {
          this->fCharsAvail = 0;
          this->fRawBufIndex = 0;
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
          ArrayJanitor<char16_t>::ArrayJanitor
                    ((ArrayJanitor<char16_t> *)&postBOMIndex,this->fSystemId,this->fMemoryManager);
          pTVar4 = (TranscodingException *)__cxa_allocate_exception(0x30);
          TranscodingException::TranscodingException
                    (pTVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                     ,0x693,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0
                     ,(XMLCh *)0x0,this->fMemoryManager);
          __cxa_throw(pTVar4,&TranscodingException::typeinfo,
                      TranscodingException::~TranscodingException);
        }
      }
    }
    break;
  case UTF_16B:
  case UTF_16L:
    if (1 < this->fRawBytesAvail) {
      asUTF16 = (UTF16Ch *)0x0;
      janValue_5.fMemoryManager = (MemoryManager *)(this->fRawByteBuf + this->fRawBufIndex);
      if ((*(short *)janValue_5.fMemoryManager == -0x101) ||
         (*(short *)janValue_5.fMemoryManager == -2)) {
        this->fRawBufIndex = this->fRawBufIndex + 2;
        janValue_5.fMemoryManager = (MemoryManager *)((long)janValue_5.fMemoryManager + 2);
        asUTF16 = (UTF16Ch *)this->fRawBufIndex;
      }
      if (this->fRawBytesAvail - this->fRawBufIndex < 0xc) {
        this->fRawBufIndex = (XMLSize_t)asUTF16;
      }
      else {
        if (this->fEncoding == UTF_16B) {
          iVar3 = memcmp(janValue_5.fMemoryManager,XMLRecognizer::fgUTF16BPre,0xc);
          if (iVar3 != 0) {
            this->fRawBufIndex = (XMLSize_t)asUTF16;
            break;
          }
        }
        else {
          iVar3 = memcmp(janValue_5.fMemoryManager,XMLRecognizer::fgUTF16LPre,0xc);
          if (iVar3 != 0) {
            this->fRawBufIndex = (XMLSize_t)asUTF16;
            break;
          }
        }
        do {
          if (this->fRawBytesAvail <= this->fRawBufIndex) break;
          if (this->fRawBytesAvail < this->fRawBufIndex + 2) {
            this->fCharsAvail = 0;
            this->fRawBufIndex = 0;
            (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
            (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr)
            ;
            ArrayJanitor<char16_t>::ArrayJanitor
                      ((ArrayJanitor<char16_t> *)&janValue_6.fMemoryManager,this->fSystemId,
                       this->fMemoryManager);
            pTVar4 = (TranscodingException *)__cxa_allocate_exception(0x30);
            TranscodingException::TranscodingException
                      (pTVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                       ,0x6da,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,
                       (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            __cxa_throw(pTVar4,&TranscodingException::typeinfo,
                        TranscodingException::~TranscodingException);
          }
          if (this->fCharsAvail == 0x3fff) {
            this->fCharsAvail = 0;
            this->fRawBufIndex = 0;
            (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
            (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr)
            ;
            ArrayJanitor<char16_t>::ArrayJanitor
                      ((ArrayJanitor<char16_t> *)local_c8,this->fSystemId,this->fMemoryManager);
            pTVar4 = (TranscodingException *)__cxa_allocate_exception(0x30);
            TranscodingException::TranscodingException
                      (pTVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                       ,0x6eb,Reader_CouldNotDecodeFirstLine,this->fSystemId,(XMLCh *)0x0,
                       (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            __cxa_throw(pTVar4,&TranscodingException::typeinfo,
                        TranscodingException::~TranscodingException);
          }
          srcPtr._6_2_ = *(UTF16Ch *)&(janValue_5.fMemoryManager)->_vptr_MemoryManager;
          this->fRawBufIndex = this->fRawBufIndex + 2;
          if ((this->fSwapped & 1U) != 0) {
            srcPtr._6_2_ = BitOps::swapBytes(srcPtr._6_2_);
          }
          this->fCharSizeBuf[this->fCharsAvail] = '\x02';
          XVar2 = this->fCharsAvail;
          this->fCharsAvail = XVar2 + 1;
          this->fCharBuf[XVar2] = srcPtr._6_2_;
          janValue_5.fMemoryManager =
               (MemoryManager *)((long)&(janValue_5.fMemoryManager)->_vptr_MemoryManager + 2);
        } while (srcPtr._6_2_ != L'>');
      }
    }
  }
  if ((this->fType == Type_PE) && (this->fRefFrom == RefFrom_NonLiteral)) {
    XVar2 = this->fCharsAvail;
    this->fCharsAvail = XVar2 + 1;
    this->fCharBuf[XVar2] = L' ';
  }
  if ((this->fCalculateSrcOfs & 1U) != 0) {
    this->fCharOfsBuf[0] = 0;
    for (local_f8 = 1; local_f8 < this->fCharsAvail; local_f8 = local_f8 + 1) {
      this->fCharOfsBuf[local_f8] =
           this->fCharOfsBuf[local_f8 - 1] + (uint)this->fCharSizeBuf[local_f8 - 1];
    }
  }
  return;
}

Assistant:

void XMLReader::doInitDecode()
{
    switch(fEncoding)
    {
        case XMLRecognizer::UCS_4B :
        case XMLRecognizer::UCS_4L :
        {
            // Remove bom if any
            if (((fRawByteBuf[0] == 0x00) && (fRawByteBuf[1] == 0x00) && (fRawByteBuf[2] == 0xFE) && (fRawByteBuf[3] == 0xFF)) ||
                ((fRawByteBuf[0] == 0xFF) && (fRawByteBuf[1] == 0xFE) && (fRawByteBuf[2] == 0x00) && (fRawByteBuf[3] == 0x00))  )
            {
                for (XMLSize_t i = 0; i < fRawBytesAvail; i++)
                    fRawByteBuf[i] = fRawByteBuf[i+4];

                fRawBytesAvail -=4;
            }

            // Look at the raw buffer as UCS4 chars
            const UCS4Ch* asUCS = reinterpret_cast<const UCS4Ch*>(fRawByteBuf);

            while (fRawBufIndex < fRawBytesAvail)
            {
                // Make sure there are at least sizeof(UCS4Ch) bytes to consume.
                if (fRawBufIndex + sizeof(UCS4Ch) > fRawBytesAvail) {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }

                // Make sure we don't exhaust the limited prolog buffer size.
                // Leave room for a space added at the end of this function.
                if (fCharsAvail == kCharBufSize - 1) {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }

                // Get out the current 4 byte value and inc our raw buf index
                UCS4Ch curVal = *asUCS++;
                fRawBufIndex += sizeof(UCS4Ch);

                // Swap if that is required for this machine
                if (fSwapped)
                    curVal = BitOps::swapBytes(curVal);

                // Make sure its at least semi legal. If not, undo and throw
                if (curVal > 0xFFFF)
                {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }

                // Convert the value to an XML char and store it
                fCharSizeBuf[fCharsAvail] = 4;
                fCharBuf[fCharsAvail++] = XMLCh(curVal);

                // Break out on the > character
                if (curVal == chCloseAngle)
                    break;
            }
            break;
        }

        case XMLRecognizer::UTF_8 :
        {
            // If there's a utf-8 BOM  (0xEF 0xBB 0xBF), skip past it.
            //   Don't move to char buf - no one wants to see it.
            //   Note: this causes any encoding= declaration to override
            //         the BOM's attempt to say that the encoding is utf-8.

            // Look at the raw buffer as short chars
            const char* asChars = (const char*)fRawByteBuf;

            if (fRawBytesAvail > XMLRecognizer::fgUTF8BOMLen &&
                XMLString::compareNString(  asChars
                                            , XMLRecognizer::fgUTF8BOM
                                            , XMLRecognizer::fgUTF8BOMLen) == 0)
            {
                fRawBufIndex += XMLRecognizer::fgUTF8BOMLen;
                asChars      += XMLRecognizer::fgUTF8BOMLen;
            }

            //
            //  First check that there are enough bytes to even see the
            //  decl indentifier. If not, get out now with no action since
            //  there is no decl.
            //
            if (fRawBytesAvail < XMLRecognizer::fgASCIIPreLen)
                break;

            // Check for the opening sequence. If not, then no decl
            if (XMLString::compareNString(  asChars
                                            , XMLRecognizer::fgASCIIPre
                                            , XMLRecognizer::fgASCIIPreLen))
            {
                break;
            }

            while (fRawBufIndex < fRawBytesAvail)
            {
                const char curCh = *asChars++;
                fRawBufIndex++;

                // Make sure we don't exhaust the limited prolog buffer size.
                // Leave room for a space added at the end of this function.
                if (fCharsAvail == kCharBufSize - 1) {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }

                // Looks ok, so store it
                fCharSizeBuf[fCharsAvail] = 1;
                fCharBuf[fCharsAvail++] = XMLCh(curCh);

                // Break out on a > character
                if (curCh == chCloseAngle)
                    break;

                //
                //  A char greater than 0x7F is not allowed in this case. If
                //  so, undo and throw.
                //
                if (curCh & 0x80)
                {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }
            }
            break;
        }

        case XMLRecognizer::UTF_16B :
        case XMLRecognizer::UTF_16L :
        {
            //
            //  If there is a decl here, we just truncate back the characters
            //  as we go. No surrogate creation would be allowed here in legal
            //  XML, so we consider it a transoding error if we find one.
            //
            if (fRawBytesAvail < 2)
                break;

            XMLSize_t postBOMIndex = 0;
            const UTF16Ch* asUTF16 = reinterpret_cast<const UTF16Ch*>(&fRawByteBuf[fRawBufIndex]);
            if ((*asUTF16 == chUnicodeMarker) || (*asUTF16 == chSwappedUnicodeMarker))
            {
                fRawBufIndex += sizeof(UTF16Ch);
                asUTF16++;
                postBOMIndex = fRawBufIndex;
            }

            //  First check that there are enough raw bytes for there to even
            //  be a decl indentifier. If not, then nothing to do.
            //
            if (fRawBytesAvail - fRawBufIndex < XMLRecognizer::fgUTF16PreLen)
            {
                fRawBufIndex = postBOMIndex;
                break;
            }

            //
            //  See we get a match on the prefix. If not, then reset and
            //  break out.
            //
            if (fEncoding == XMLRecognizer::UTF_16B)
            {
                if (memcmp(asUTF16, XMLRecognizer::fgUTF16BPre, XMLRecognizer::fgUTF16PreLen))
                {
                    fRawBufIndex = postBOMIndex;
                    break;
                }
            }
             else
            {
                if (memcmp(asUTF16, XMLRecognizer::fgUTF16LPre, XMLRecognizer::fgUTF16PreLen))
                {
                    fRawBufIndex = postBOMIndex;
                    break;
                }
            }

            while (fRawBufIndex < fRawBytesAvail)
            {
                // Make sure there are at least sizeof(UTF16Ch) bytes to consume.
                if (fRawBufIndex + sizeof(UTF16Ch) > fRawBytesAvail) {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }

                // Make sure we don't exhaust the limited prolog buffer size.
                // Leave room for a space added at the end of this function.
                if (fCharsAvail == kCharBufSize - 1) {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }

                // Get out the current 2 byte value
                UTF16Ch curVal = *asUTF16++;
                fRawBufIndex += sizeof(UTF16Ch);

                // Swap if that is required for this machine
                if (fSwapped)
                    curVal = BitOps::swapBytes(curVal);

                //
                //  Store it and bump the target index, implicitly converting
                //  if UTF16Ch and XMLCh are not the same size.
                //
                fCharSizeBuf[fCharsAvail] = 2;
                fCharBuf[fCharsAvail++] = curVal;

                // Break out on a > char
                if (curVal == chCloseAngle)
                    break;
            }
            break;
        }

        case XMLRecognizer::EBCDIC :
        {
            //
            //  We use special support in the intrinsic EBCDIC-US transcoder
            //  to go through one char at a time.
            //
            const XMLByte* srcPtr = fRawByteBuf;
            while (1)
            {
                // Transcode one char from the source
                const XMLCh chCur = XMLEBCDICTranscoder::xlatThisOne(*srcPtr++);
                fRawBufIndex++;

                // Make sure we don't exhaust the limited prolog buffer size.
                // Leave room for a space added at the end of this function.
                if (fCharsAvail == kCharBufSize - 1) {
                    fCharsAvail = 0;
                    fRawBufIndex = 0;
                    fMemoryManager->deallocate(fPublicId);
                    fMemoryManager->deallocate(fEncodingStr);
                    ArrayJanitor<XMLCh> janValue(fSystemId, fMemoryManager);
                    ThrowXMLwithMemMgr1
                    (
                        TranscodingException
                        , XMLExcepts::Reader_CouldNotDecodeFirstLine
                        , fSystemId
                        , fMemoryManager
                    );
                }


                //
                //  And put it into the character buffer. This stuff has to
                //  look like it was normally transcoded.
                //
                fCharSizeBuf[fCharsAvail] = 1;
                fCharBuf[fCharsAvail++] = chCur;

                // If its a > char, then break out
                if (chCur == chCloseAngle)
                    break;

                // Watch for using up all input and get out
                if (fRawBufIndex == fRawBytesAvail)
                    break;
            }
            break;
        }

        default :
            // It should never be anything else here
            fMemoryManager->deallocate(fPublicId);
            fMemoryManager->deallocate(fEncodingStr);
            fMemoryManager->deallocate(fSystemId);
            ThrowXMLwithMemMgr(TranscodingException, XMLExcepts::Reader_BadAutoEncoding, fMemoryManager);
            break;
    }

    //
    //  Ok, by the time we get here, if its a legal XML file we have eaten
    //  the XML/TextDecl. So, if we are a PE and are being referenced from
    //  outside a literal, then we need to throw in an arbitrary space that
    //  is required by XML.
    //
    if ((fType == Type_PE) && (fRefFrom == RefFrom_NonLiteral))
        fCharBuf[fCharsAvail++] = chSpace;

    //  Calculate fCharOfsBuf buffer using the elements from fCharBufSize
    if (fCalculateSrcOfs)
    {
        fCharOfsBuf[0] = 0;
        for (XMLSize_t index = 1; index < fCharsAvail; ++index) {
            fCharOfsBuf[index] = fCharOfsBuf[index-1]+fCharSizeBuf[index-1];
        }
    }
}